

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterMain.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  string filename;
  Interpreter interpreter;
  ifstream ifs;
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined1 local_290;
  undefined7 uStack_28f;
  Interpreter local_280;
  long *local_218 [2];
  long local_208 [63];
  
  local_298 = 0;
  local_290 = 0;
  local_2a0 = &local_290;
  if ((uint)argc < 2) {
    puts("Type filename:");
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_2a0,cVar1);
  }
  else {
    std::__cxx11::string::string((string *)local_218,argv[1],(allocator *)&local_280);
    std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_218);
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
  }
  std::ifstream::ifstream(local_218,(string *)&local_2a0,_S_in);
  Interpreter::Interpreter(&local_280,(ifstream *)local_218);
  Interpreter::load(&local_280);
  Interpreter::run(&local_280);
  if (local_280.callList.super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.callList.
                    super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.callList.
                          super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.callList.
                          super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>,_std::_Select1st<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
  ::~_Rb_tree(&local_280.operations._M_t);
  std::ifstream::~ifstream(local_218);
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string filename;
    if (argc == 0 || argc == 1) {
        printf("Type filename:\n");
        getline(std::cin, filename);
    } else {
        filename = std::string(argv[1]);
    }

    std::ifstream ifs(filename);
    Interpreter interpreter(ifs);

    interpreter.load();

#ifdef MEASURE_TIME
#ifdef MEASURE_TIME_MILLIS
    long time = getCurrentTime();
#else
    clock_t time = clock();
#endif
    for (int i = 0; i < MEASURE_COUNT; i++) {
        interpreter.setOpPos(0);
#endif

        interpreter.run();

#ifdef MEASURE_TIME
    }
#ifdef MEASURE_TIME_MILLIS
    time = getCurrentTime() - time;
#else
    time = clock() - time;
#endif
    printf("completed %i iterations in %li\n", MEASURE_COUNT, time);
#endif

    return 0;
}